

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *
__thiscall
VFS::CVFS::CVFSDir::GetChilds
          (vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           *__return_storage_ptr__,CVFSDir *this)

{
  time_t tVar1;
  time_point local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  CVFSDir *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&(this->super_CVFSNode).m_UpdateLock);
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_28);
  (this->super_CVFSNode).m_Accessed = tVar1;
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  vector(__return_storage_ptr__,&this->m_Childs);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VFSNode> GetChilds()
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        m_Accessed = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
                        return m_Childs;
                    }